

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlTextReaderRead(xmlTextReaderPtr reader)

{
  xmlElementType xVar1;
  xmlParserCtxtPtr pxVar2;
  xmlNodePtr pxVar3;
  xmlChar *str;
  int iVar4;
  int iVar5;
  int iVar6;
  xmlNodePtr pxVar7;
  xmlXIncludeCtxtPtr ctxt;
  long lVar8;
  _xmlNode *p_Var9;
  _xmlNode *p_Var10;
  xmlTextReaderState xVar11;
  xmlNodePtr cur;
  xmlNodePtr tmp;
  
  iVar6 = -1;
  if (reader != (xmlTextReaderPtr)0x0) {
    reader->curnode = (xmlNodePtr)0x0;
    if (reader->doc == (xmlDocPtr)0x0) {
      if (reader->ctxt != (xmlParserCtxtPtr)0x0) {
        if (reader->mode != 0) {
          xVar11 = reader->state;
          iVar4 = reader->ctxt->nodeNr;
          cur = reader->node;
          goto LAB_001a161b;
        }
        reader->mode = 1;
        do {
          iVar4 = xmlTextReaderPushData(reader);
          if (iVar4 < 0) goto LAB_001a1888;
          pxVar2 = reader->ctxt;
          if (pxVar2->node != (xmlNodePtr)0x0) {
            if (pxVar2->myDoc != (xmlDocPtr)0x0) {
              reader->node = pxVar2->myDoc->children;
            }
            if (reader->node == (xmlNodePtr)0x0) {
              reader->node = *pxVar2->nodeTab;
            }
            goto LAB_001a15f2;
          }
        } while ((reader->mode != 3) && (reader->state != XML_TEXTREADER_DONE));
        if (pxVar2->myDoc != (xmlDocPtr)0x0) {
          reader->node = pxVar2->myDoc->children;
        }
        if (reader->node != (xmlNodePtr)0x0) {
LAB_001a15f2:
          reader->state = XML_TEXTREADER_ELEMENT;
          reader->depth = 0;
          pxVar2->parseMode = XML_PARSE_READER;
          xVar11 = XML_TEXTREADER_START;
          cur = (xmlNodePtr)0x0;
          iVar4 = 0;
          do {
            pxVar7 = reader->node;
            if ((((pxVar7 != (xmlNodePtr)0x0) && (pxVar7->next == (_xmlNode *)0x0)) &&
                (pxVar7->type - XML_TEXT_NODE < 2)) &&
               (pxVar7 = xmlTextReaderExpand(reader), pxVar7 == (xmlNodePtr)0x0)) {
              return -1;
            }
            if ((((reader->xinclude != 0) && (reader->in_xinclude == 0)) &&
                ((pxVar7 = reader->node, pxVar7 != (xmlNodePtr)0x0 &&
                 ((pxVar7->type == XML_ELEMENT_NODE && (pxVar7->ns != (xmlNs *)0x0)))))) &&
               ((iVar5 = xmlStrEqual(pxVar7->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
                iVar5 != 0 ||
                (iVar5 = xmlStrEqual(reader->node->ns->href,
                                     (xmlChar *)"http://www.w3.org/2001/XInclude"), iVar5 != 0)))) {
              if (reader->xincctxt == (xmlXIncludeCtxtPtr)0x0) {
                ctxt = xmlXIncludeNewContext(reader->ctxt->myDoc);
                reader->xincctxt = ctxt;
                xmlXIncludeSetFlags(ctxt,reader->parserFlags & 0xffff7fff);
              }
              pxVar7 = xmlTextReaderExpand(reader);
              if (pxVar7 == (xmlNodePtr)0x0) {
                return -1;
              }
              xmlXIncludeProcessNode(reader->xincctxt,reader->node);
            }
            pxVar7 = reader->node;
            if (pxVar7 == (xmlNodePtr)0x0) {
LAB_001a1a3a:
              pxVar7 = reader->node;
              if ((((pxVar7 == (xmlNodePtr)0x0) || (pxVar7->type != XML_ENTITY_DECL)) ||
                  (reader->ent == (xmlNodePtr)0x0)) || (reader->ent->children != pxVar7)) {
                if ((pxVar7 != (xmlNodePtr)0x0) && (reader->validate != XML_TEXTREADER_NOT_VALIDATE)
                   ) {
                  if ((pxVar7->type == XML_ELEMENT_NODE) &&
                     ((reader->state != XML_TEXTREADER_END &&
                      (reader->state != XML_TEXTREADER_BACKTRACK)))) {
                    xmlTextReaderValidatePush(reader);
                  }
                  else if (pxVar7->type - XML_TEXT_NODE < 2) {
                    str = pxVar7->content;
                    iVar6 = xmlStrlen(str);
                    xmlTextReaderValidateCData(reader,str,iVar6);
                  }
                }
                if ((((reader->patternNr < 1) || (reader->state == XML_TEXTREADER_END)) ||
                    (reader->state == XML_TEXTREADER_BACKTRACK)) || (reader->patternNr < 1))
                goto LAB_001a1c3d;
                lVar8 = 0;
                goto LAB_001a1c0b;
              }
              iVar5 = reader->entNr;
              lVar8 = (long)iVar5;
              pxVar7 = (xmlNodePtr)0x0;
              if (0 < lVar8) {
                reader->entNr = iVar5 + -1;
                pxVar7 = (xmlNodePtr)0x0;
                if (iVar5 != 1) {
                  pxVar7 = reader->entTab[lVar8 + -2];
                }
                reader->ent = pxVar7;
                pxVar7 = reader->entTab[lVar8 + -1];
                reader->entTab[lVar8 + -1] = (xmlNodePtr)0x0;
              }
              reader->node = pxVar7;
              reader->depth = reader->depth + 1;
            }
            else {
              if (pxVar7->type != XML_XINCLUDE_START) {
                if (pxVar7 != (xmlNodePtr)0x0) {
                  if (pxVar7->type == XML_XINCLUDE_END) {
                    reader->in_xinclude = reader->in_xinclude + -1;
                    goto LAB_001a161b;
                  }
                  if (pxVar7 != (xmlNodePtr)0x0) {
                    if (((pxVar7->type == XML_ENTITY_REF_NODE) &&
                        (reader->ctxt != (xmlParserCtxtPtr)0x0)) &&
                       (reader->ctxt->replaceEntities == 1)) {
                      p_Var10 = pxVar7->children;
                      if (((p_Var10 != (_xmlNode *)0x0) && (p_Var10->type == XML_ENTITY_DECL)) &&
                         (p_Var10->children != (_xmlNode *)0x0)) {
                        xmlTextReaderEntPush(reader,pxVar7);
                        reader->node = reader->node->children->children;
                      }
                    }
                    else if (((pxVar7 != (xmlNodePtr)0x0) && (pxVar7->type == XML_ENTITY_REF_NODE))
                            && ((reader->ctxt != (xmlParserCtxtPtr)0x0 &&
                                (reader->validate != XML_TEXTREADER_NOT_VALIDATE)))) {
                      xmlTextReaderValidateEntity(reader);
                    }
                  }
                }
                goto LAB_001a1a3a;
              }
              reader->in_xinclude = reader->in_xinclude + 1;
            }
LAB_001a161b:
            if (reader->node == (xmlNodePtr)0x0) {
              return -(uint)(reader->mode != 3);
            }
            while (((((pxVar7 = reader->node, pxVar7 != (xmlNodePtr)0x0 &&
                      (pxVar7->next == (_xmlNode *)0x0)) &&
                     (pxVar2 = reader->ctxt, pxVar2->nodeNr == iVar4)) &&
                    ((((xVar11 == XML_TEXTREADER_BACKTRACK ||
                       (p_Var10 = pxVar7->children, p_Var10 == (_xmlNode *)0x0)) ||
                      ((xVar1 = pxVar7->type, xVar1 == XML_ENTITY_REF_NODE ||
                       ((p_Var10->type == XML_TEXT_NODE && (p_Var10->next == (_xmlNode *)0x0))))))
                     || ((xVar1 < XML_ELEMENT_DECL &&
                         ((0x6200U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)))))
                    ) && (((pxVar3 = pxVar2->node, pxVar3 == pxVar7 || pxVar3 == (xmlNodePtr)0x0 ||
                           (pxVar3 == pxVar7->parent)) && (pxVar2->instate != XML_PARSER_EOF))))) {
              iVar5 = xmlTextReaderPushData(reader);
              if (iVar5 < 0) goto LAB_001a1888;
              if (reader->node == (xmlNodePtr)0x0) goto LAB_001a16be;
            }
            if (((xVar11 == XML_TEXTREADER_BACKTRACK) || (pxVar7->children == (_xmlNode *)0x0)) ||
               ((pxVar7->type < XML_XINCLUDE_END &&
                ((0x84020U >> (pxVar7->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)))) {
              if (pxVar7->next == (_xmlNode *)0x0) {
                if (((xVar11 == XML_TEXTREADER_ELEMENT) && (pxVar7->type == XML_ELEMENT_NODE)) &&
                   ((pxVar7->children == (_xmlNode *)0x0 && ((pxVar7->extra & 1) == 0))))
                goto LAB_001a17ed;
                if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) &&
                   (pxVar7->type == XML_ELEMENT_NODE)) {
                  xmlTextReaderValidatePop(reader);
                }
                if ((0 < reader->preserves) && ((reader->node->extra & 4) != 0)) {
                  reader->preserves = reader->preserves + -1;
                }
                p_Var10 = reader->node->parent;
                reader->node = p_Var10;
                if ((p_Var10 == (_xmlNode *)0x0) ||
                   ((p_Var10->type < (XML_XINCLUDE_END|XML_ATTRIBUTE_NODE) &&
                    ((0x202200U >> (p_Var10->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0
                    )))) {
                  if (reader->mode != 3) {
                    iVar6 = xmlParseChunk(reader->ctxt,"",0,1);
                    reader->state = XML_TEXTREADER_DONE;
                    if (iVar6 != 0) {
                      return -1;
                    }
                  }
                  reader->node = (xmlNodePtr)0x0;
                  reader->depth = -1;
                  if ((((cur != (xmlNodePtr)0x0) && (reader->preserves == 0)) &&
                      (reader->in_xinclude == 0)) &&
                     (((reader->entNr == 0 && (cur->type != XML_DTD_NODE)) &&
                      ((cur->extra & 2) == 0)))) {
                    xmlUnlinkNode(cur);
                    xmlTextReaderFreeNode(reader,cur);
                  }
LAB_001a16be:
                  reader->state = XML_TEXTREADER_DONE;
                  return 0;
                }
                if (((reader->preserves == 0) && (reader->in_xinclude == 0)) &&
                   ((reader->entNr == 0 &&
                    ((pxVar7 = p_Var10->last, pxVar7 != (xmlNodePtr)0x0 &&
                     ((pxVar7->extra & 2) == 0)))))) {
                  xmlUnlinkNode(pxVar7);
                  xmlTextReaderFreeNode(reader,pxVar7);
                }
                reader->depth = reader->depth + -1;
                reader->state = XML_TEXTREADER_BACKTRACK;
              }
              else if ((((xVar11 == XML_TEXTREADER_ELEMENT) && (pxVar7->type == XML_ELEMENT_NODE))
                       && (pxVar7->children == (_xmlNode *)0x0)) &&
                      (((pxVar7->extra & 1) == 0 && (reader->in_xinclude < 1)))) {
LAB_001a17ed:
                reader->state = XML_TEXTREADER_END;
                xVar11 = XML_TEXTREADER_ELEMENT;
              }
              else {
                if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) &&
                   (pxVar7->type == XML_ELEMENT_NODE)) {
                  xmlTextReaderValidatePop(reader);
                }
                if ((0 < reader->preserves) && ((reader->node->extra & 4) != 0)) {
                  reader->preserves = reader->preserves + -1;
                }
                p_Var10 = reader->node->next;
                reader->node = p_Var10;
                reader->state = XML_TEXTREADER_ELEMENT;
                if ((((reader->preserves == 0) && (reader->in_xinclude == 0)) &&
                    (reader->entNr == 0)) &&
                   (((pxVar7 = p_Var10->prev, pxVar7 != (xmlNodePtr)0x0 &&
                     (pxVar7->type != XML_DTD_NODE)) && ((pxVar7->extra & 2) == 0)))) {
                  if (cur == pxVar7) {
                    cur = (xmlNodePtr)0x0;
                  }
                  xmlUnlinkNode(pxVar7);
                  xmlTextReaderFreeNode(reader,pxVar7);
                }
              }
            }
            else {
              reader->node = pxVar7->children;
              reader->depth = reader->depth + 1;
              reader->state = XML_TEXTREADER_ELEMENT;
            }
          } while( true );
        }
LAB_001a1888:
        reader->mode = 2;
        reader->state = XML_TEXTREADER_ERROR;
      }
    }
    else {
      iVar6 = 0;
      if (reader->state != XML_TEXTREADER_END) {
        p_Var10 = reader->node;
        do {
          if (p_Var10 == (_xmlNode *)0x0) {
            p_Var9 = reader->doc->children;
            if (p_Var9 == (_xmlNode *)0x0) goto LAB_001a1572;
LAB_001a1500:
            reader->node = p_Var9;
LAB_001a1504:
            xVar11 = XML_TEXTREADER_START;
            p_Var10 = p_Var9;
          }
          else if ((reader->state == XML_TEXTREADER_BACKTRACK) ||
                  ((xVar1 = p_Var10->type, xVar1 < XML_XINCLUDE_END &&
                   ((0x84020U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)))) {
LAB_001a14c5:
            p_Var9 = p_Var10->next;
            if (p_Var9 != (_xmlNode *)0x0) goto LAB_001a1500;
            p_Var9 = p_Var10->parent;
            if (p_Var9 == (_xmlNode *)0x0) {
              xVar11 = XML_TEXTREADER_END;
            }
            else {
              if ((p_Var9->type | XML_CDATA_SECTION_NODE) == XML_HTML_DOCUMENT_NODE) {
LAB_001a1572:
                reader->state = XML_TEXTREADER_END;
                return 0;
              }
              reader->node = p_Var9;
              reader->depth = reader->depth + -1;
              xVar11 = XML_TEXTREADER_BACKTRACK;
              p_Var10 = p_Var9;
            }
          }
          else {
            p_Var9 = p_Var10->children;
            if (p_Var9 != (_xmlNode *)0x0) {
              reader->node = p_Var9;
              reader->depth = reader->depth + 1;
              goto LAB_001a1504;
            }
            xVar11 = XML_TEXTREADER_BACKTRACK;
            if (xVar1 != XML_ATTRIBUTE_NODE) goto LAB_001a14c5;
          }
          reader->state = xVar11;
        } while (p_Var10->type - XML_XINCLUDE_START < 2);
        iVar6 = 1;
      }
    }
  }
  return iVar6;
  while (lVar8 = lVar8 + 1, lVar8 < reader->patternNr) {
LAB_001a1c0b:
    iVar6 = xmlPatternMatch(reader->patternTab[lVar8],reader->node);
    if (iVar6 == 1) {
      xmlTextReaderPreserve(reader);
      break;
    }
  }
LAB_001a1c3d:
  if (reader->validate != XML_TEXTREADER_VALIDATE_XSD) {
    return 1;
  }
  if (reader->xsdValidErrors != 0) {
    return 1;
  }
  if (reader->xsdValidCtxt == (xmlSchemaValidCtxtPtr)0x0) {
    return 1;
  }
  iVar6 = xmlSchemaIsValid(reader->xsdValidCtxt);
  reader->xsdValidErrors = (uint)(iVar6 == 0);
  return 1;
}

Assistant:

int
xmlTextReaderRead(xmlTextReaderPtr reader) {
    int val, olddepth = 0;
    xmlTextReaderState oldstate = XML_TEXTREADER_START;
    xmlNodePtr oldnode = NULL;


    if (reader == NULL)
	return(-1);
    reader->curnode = NULL;
    if (reader->doc != NULL)
        return(xmlTextReaderReadTree(reader));
    if (reader->ctxt == NULL)
	return(-1);

#ifdef DEBUG_READER
    fprintf(stderr, "\nREAD ");
    DUMP_READER
#endif
    if (reader->mode == XML_TEXTREADER_MODE_INITIAL) {
	reader->mode = XML_TEXTREADER_MODE_INTERACTIVE;
	/*
	 * Initial state
	 */
	do {
	    val = xmlTextReaderPushData(reader);
		if (val < 0){
			reader->mode = XML_TEXTREADER_MODE_ERROR;
			reader->state = XML_TEXTREADER_ERROR;
		return(-1);
		}
	} while ((reader->ctxt->node == NULL) &&
		 ((reader->mode != XML_TEXTREADER_MODE_EOF) &&
		  (reader->state != XML_TEXTREADER_DONE)));
	if (reader->ctxt->node == NULL) {
	    if (reader->ctxt->myDoc != NULL) {
		reader->node = reader->ctxt->myDoc->children;
	    }
	    if (reader->node == NULL){
			reader->mode = XML_TEXTREADER_MODE_ERROR;
			reader->state = XML_TEXTREADER_ERROR;
		return(-1);
		}
	    reader->state = XML_TEXTREADER_ELEMENT;
	} else {
	    if (reader->ctxt->myDoc != NULL) {
		reader->node = reader->ctxt->myDoc->children;
	    }
	    if (reader->node == NULL)
		reader->node = reader->ctxt->nodeTab[0];
	    reader->state = XML_TEXTREADER_ELEMENT;
	}
	reader->depth = 0;
	reader->ctxt->parseMode = XML_PARSE_READER;
	goto node_found;
    }
    oldstate = reader->state;
    olddepth = reader->ctxt->nodeNr;
    oldnode = reader->node;

get_next_node:
    if (reader->node == NULL) {
	if (reader->mode == XML_TEXTREADER_MODE_EOF)
	    return(0);
	else
	    return(-1);
    }

    /*
     * If we are not backtracking on ancestors or examined nodes,
     * that the parser didn't finished or that we aren't at the end
     * of stream, continue processing.
     */
    while ((reader->node != NULL) && (reader->node->next == NULL) &&
	   (reader->ctxt->nodeNr == olddepth) &&
           ((oldstate == XML_TEXTREADER_BACKTRACK) ||
            (reader->node->children == NULL) ||
	    (reader->node->type == XML_ENTITY_REF_NODE) ||
	    ((reader->node->children != NULL) &&
	     (reader->node->children->type == XML_TEXT_NODE) &&
	     (reader->node->children->next == NULL)) ||
	    (reader->node->type == XML_DTD_NODE) ||
	    (reader->node->type == XML_DOCUMENT_NODE) ||
	    (reader->node->type == XML_HTML_DOCUMENT_NODE)) &&
	   ((reader->ctxt->node == NULL) ||
	    (reader->ctxt->node == reader->node) ||
	    (reader->ctxt->node == reader->node->parent)) &&
	   (reader->ctxt->instate != XML_PARSER_EOF)) {
	val = xmlTextReaderPushData(reader);
	if (val < 0){
		reader->mode = XML_TEXTREADER_MODE_ERROR;
		reader->state = XML_TEXTREADER_ERROR;
	    return(-1);
	}
	if (reader->node == NULL)
	    goto node_end;
    }
    if (oldstate != XML_TEXTREADER_BACKTRACK) {
	if ((reader->node->children != NULL) &&
	    (reader->node->type != XML_ENTITY_REF_NODE) &&
	    (reader->node->type != XML_XINCLUDE_START) &&
	    (reader->node->type != XML_DTD_NODE)) {
	    reader->node = reader->node->children;
	    reader->depth++;
	    reader->state = XML_TEXTREADER_ELEMENT;
	    goto node_found;
	}
    }
    if (reader->node->next != NULL) {
	if ((oldstate == XML_TEXTREADER_ELEMENT) &&
            (reader->node->type == XML_ELEMENT_NODE) &&
	    (reader->node->children == NULL) &&
	    ((reader->node->extra & NODE_IS_EMPTY) == 0)
#ifdef LIBXML_XINCLUDE_ENABLED
	    && (reader->in_xinclude <= 0)
#endif
	    ) {
	    reader->state = XML_TEXTREADER_END;
	    goto node_found;
	}
#ifdef LIBXML_REGEXP_ENABLED
	if ((reader->validate) &&
	    (reader->node->type == XML_ELEMENT_NODE))
	    xmlTextReaderValidatePop(reader);
#endif /* LIBXML_REGEXP_ENABLED */
        if ((reader->preserves > 0) &&
	    (reader->node->extra & NODE_IS_SPRESERVED))
	    reader->preserves--;
	reader->node = reader->node->next;
	reader->state = XML_TEXTREADER_ELEMENT;

	/*
	 * Cleanup of the old node
	 */
	if ((reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
	    (reader->in_xinclude == 0) &&
#endif
	    (reader->entNr == 0) &&
	    (reader->node->prev != NULL) &&
            (reader->node->prev->type != XML_DTD_NODE)) {
	    xmlNodePtr tmp = reader->node->prev;
	    if ((tmp->extra & NODE_IS_PRESERVED) == 0) {
                if (oldnode == tmp)
                    oldnode = NULL;
		xmlUnlinkNode(tmp);
		xmlTextReaderFreeNode(reader, tmp);
	    }
	}

	goto node_found;
    }
    if ((oldstate == XML_TEXTREADER_ELEMENT) &&
	(reader->node->type == XML_ELEMENT_NODE) &&
	(reader->node->children == NULL) &&
	((reader->node->extra & NODE_IS_EMPTY) == 0)) {;
	reader->state = XML_TEXTREADER_END;
	goto node_found;
    }
#ifdef LIBXML_REGEXP_ENABLED
    if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) && (reader->node->type == XML_ELEMENT_NODE))
	xmlTextReaderValidatePop(reader);
#endif /* LIBXML_REGEXP_ENABLED */
    if ((reader->preserves > 0) &&
	(reader->node->extra & NODE_IS_SPRESERVED))
	reader->preserves--;
    reader->node = reader->node->parent;
    if ((reader->node == NULL) ||
	(reader->node->type == XML_DOCUMENT_NODE) ||
#ifdef LIBXML_DOCB_ENABLED
	(reader->node->type == XML_DOCB_DOCUMENT_NODE) ||
#endif
	(reader->node->type == XML_HTML_DOCUMENT_NODE)) {
	if (reader->mode != XML_TEXTREADER_MODE_EOF) {
	    val = xmlParseChunk(reader->ctxt, "", 0, 1);
	    reader->state = XML_TEXTREADER_DONE;
	    if (val != 0)
	        return(-1);
	}
	reader->node = NULL;
	reader->depth = -1;

	/*
	 * Cleanup of the old node
	 */
	if ((oldnode != NULL) && (reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
	    (reader->in_xinclude == 0) &&
#endif
	    (reader->entNr == 0) &&
	    (oldnode->type != XML_DTD_NODE) &&
	    ((oldnode->extra & NODE_IS_PRESERVED) == 0)) {
	    xmlUnlinkNode(oldnode);
	    xmlTextReaderFreeNode(reader, oldnode);
	}

	goto node_end;
    }
    if ((reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
        (reader->in_xinclude == 0) &&
#endif
	(reader->entNr == 0) &&
        (reader->node->last != NULL) &&
        ((reader->node->last->extra & NODE_IS_PRESERVED) == 0)) {
	xmlNodePtr tmp = reader->node->last;
	xmlUnlinkNode(tmp);
	xmlTextReaderFreeNode(reader, tmp);
    }
    reader->depth--;
    reader->state = XML_TEXTREADER_BACKTRACK;

node_found:
    DUMP_READER

    /*
     * If we are in the middle of a piece of CDATA make sure it's finished
     */
    if ((reader->node != NULL) &&
        (reader->node->next == NULL) &&
        ((reader->node->type == XML_TEXT_NODE) ||
	 (reader->node->type == XML_CDATA_SECTION_NODE))) {
            if (xmlTextReaderExpand(reader) == NULL)
	        return -1;
    }

#ifdef LIBXML_XINCLUDE_ENABLED
    /*
     * Handle XInclude if asked for
     */
    if ((reader->xinclude) && (reader->in_xinclude == 0) &&
        (reader->node != NULL) &&
	(reader->node->type == XML_ELEMENT_NODE) &&
	(reader->node->ns != NULL) &&
	((xmlStrEqual(reader->node->ns->href, XINCLUDE_NS)) ||
	 (xmlStrEqual(reader->node->ns->href, XINCLUDE_OLD_NS)))) {
	if (reader->xincctxt == NULL) {
	    reader->xincctxt = xmlXIncludeNewContext(reader->ctxt->myDoc);
	    xmlXIncludeSetFlags(reader->xincctxt,
	                        reader->parserFlags & (~XML_PARSE_NOXINCNODE));
	}